

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte *local_50;
  char_t *str_2;
  char_t *str_1;
  byte *pbStack_38;
  char_t ss;
  char_t *str;
  gap g;
  byte *pbStack_18;
  char_t end_quote_local;
  char_t *s_local;
  
  g.size._7_1_ = end_quote;
  pbStack_18 = (byte *)s;
  gap::gap((gap *)&str);
  pbVar1 = pbStack_18;
  if (((anonymous_namespace)::chartype_table[*pbStack_18] & 8) != 0) {
    pbStack_38 = pbStack_18;
    do {
      pbStack_38 = pbStack_38 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbStack_38] & 8) != 0);
    gap::push((gap *)&str,(char_t **)&stack0xffffffffffffffe8,(long)pbStack_38 - (long)pbStack_18);
    pbVar1 = pbStack_18;
  }
  do {
    while (pbStack_18 = pbVar1, ((anonymous_namespace)::chartype_table[*pbStack_18] & 0xc) != 0) {
LAB_0015d35d:
      if (*pbStack_18 == g.size._7_1_) {
        str_2 = gap::flush((gap *)&str,(char_t *)pbStack_18);
        do {
          pbVar1 = (byte *)(str_2 + -1);
          *str_2 = '\0';
          str_2 = (char_t *)pbVar1;
        } while (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0);
        return (char_t *)(pbStack_18 + 1);
      }
      if (((anonymous_namespace)::chartype_table[*pbStack_18] & 8) == 0) {
        if (*pbStack_18 == 0x26) {
          pbVar1 = (byte *)strconv_escape((char_t *)pbStack_18,(gap *)&str);
        }
        else {
          if (*pbStack_18 == 0) {
            return (char_t *)0x0;
          }
          pbVar1 = pbStack_18 + 1;
        }
      }
      else {
        pbVar1 = pbStack_18 + 1;
        *pbStack_18 = 0x20;
        if (((anonymous_namespace)::chartype_table[*pbVar1] & 8) != 0) {
          local_50 = pbStack_18 + 2;
          while (((anonymous_namespace)::chartype_table[*local_50] & 8) != 0) {
            local_50 = local_50 + 1;
          }
          pbStack_18 = pbVar1;
          gap::push((gap *)&str,(char_t **)&stack0xffffffffffffffe8,(long)local_50 - (long)pbVar1);
          pbVar1 = pbStack_18;
        }
      }
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[1]] & 0xc) != 0) {
      pbStack_18 = pbStack_18 + 1;
      goto LAB_0015d35d;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[2]] & 0xc) != 0) {
      pbStack_18 = pbStack_18 + 2;
      goto LAB_0015d35d;
    }
    if (((anonymous_namespace)::chartype_table[pbStack_18[3]] & 0xc) != 0) {
      pbStack_18 = pbStack_18 + 3;
      goto LAB_0015d35d;
    }
    pbVar1 = pbStack_18 + 4;
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI__IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI__IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI__IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI__IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI__IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI__IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}